

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O0

void __thiscall
de::Random::
choose<__gnu_cxx::__normal_iterator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,unsigned_long>*,std::vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,unsigned_long>,std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,unsigned_long>>>>,std::pair<vkt::memory::(anonymous_namespace)::MemoryType,unsigned_long>*>
          (Random *this,
          __normal_iterator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_*,_std::vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>_>
          first,__normal_iterator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_*,_std::vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>_>
                last,pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long> *result,
          int numItems)

{
  bool bVar1;
  int iVar2;
  reference ppVar3;
  int local_30;
  int r;
  int ndx;
  int numItems_local;
  pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long> *result_local;
  Random *this_local;
  __normal_iterator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_*,_std::vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>_>
  last_local;
  __normal_iterator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_*,_std::vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>_>
  first_local;
  
  local_30 = 0;
  this_local = (Random *)last._M_current;
  last_local._M_current = first._M_current;
  while (bVar1 = __gnu_cxx::operator!=
                           (&last_local,
                            (__normal_iterator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_*,_std::vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>_>
                             *)&this_local), bVar1) {
    if (local_30 < numItems) {
      ppVar3 = __gnu_cxx::
               __normal_iterator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_*,_std::vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>_>
               ::operator*(&last_local);
      std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>::operator=
                (result + local_30,ppVar3);
    }
    else {
      iVar2 = getInt(this,0,local_30);
      if (iVar2 < numItems) {
        ppVar3 = __gnu_cxx::
                 __normal_iterator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_*,_std::vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>_>
                 ::operator*(&last_local);
        std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>::operator=
                  (result + iVar2,ppVar3);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_*,_std::vector<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>,_std::allocator<std::pair<vkt::memory::(anonymous_namespace)::MemoryType,_unsigned_long>_>_>_>
    ::operator++(&last_local);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void Random::choose (InputIter first, InputIter last, OutputIter result, int numItems)
{
	// Algorithm: Reservoir sampling
	// http://en.wikipedia.org/wiki/Reservoir_sampling
	// \note Will not work for suffling an array. Use suffle() instead.

	int ndx;
	for (ndx = 0; first != last; ++first, ++ndx)
	{
		if (ndx < numItems)
			*(result + ndx) = *first;
		else
		{
			int r = getInt(0, ndx);
			if (r < numItems)
				*(result + r) = *first;
		}
	}

	DE_ASSERT(ndx >= numItems);
}